

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,char *hostp,int port,char *key,size_t keylen,
                   int typemask,libssh2_knownhost **ext)

{
  short sVar1;
  char *key_00;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  HMAC_CTX *ctx_00;
  EVP_MD *md;
  size_t len_00;
  libssh2_knownhost *plVar5;
  bool bVar6;
  bool bVar7;
  int known_key_type;
  int host_key_type;
  HMAC_CTX *ctx;
  uchar hash [20];
  size_t nlen;
  int len;
  int match;
  int numcheck;
  char *host;
  char hostbuff [270];
  char *pcStack_60;
  int rc;
  char *keyalloc;
  known_host *pkStack_50;
  int type;
  known_host *badkey;
  known_host *node;
  size_t sStack_38;
  int typemask_local;
  size_t keylen_local;
  char *key_local;
  char **ppcStack_20;
  int port_local;
  char *hostp_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  pkStack_50 = (known_host *)0x0;
  keyalloc._4_4_ = typemask & 0xffff;
  pcStack_60 = (char *)0x0;
  stack0xffffffffffffff9c = 2;
  bVar6 = false;
  if (keyalloc._4_4_ == 2) {
    hosts_local._4_4_ = 1;
  }
  else {
    node._4_4_ = typemask;
    sStack_38 = keylen;
    keylen_local = (size_t)key;
    key_local._4_4_ = port;
    ppcStack_20 = (char **)hostp;
    hostp_local = (char *)hosts;
    if (port < 0) {
      len = 1;
      _match = (char **)hostp;
    }
    else {
      iVar2 = snprintf((char *)&host,0x10e,"[%s]:%d",hostp,(ulong)(uint)port);
      if ((iVar2 < 0) || (0x10d < iVar2)) {
        _libssh2_error(*(LIBSSH2_SESSION **)hostp_local,-0x26,"Known-host write buffer too small");
        return 3;
      }
      _match = &host;
      len = 2;
    }
    if ((node._4_4_ & 0x20000) == 0) {
      sVar4 = _libssh2_base64_encode
                        (*(LIBSSH2_SESSION **)hostp_local,(char *)keylen_local,sStack_38,
                         &stack0xffffffffffffffa0);
      if (sVar4 == 0) {
        _libssh2_error(*(LIBSSH2_SESSION **)hostp_local,-6,
                       "Unable to allocate memory for base64-encoded key");
        return 3;
      }
      keylen_local = (size_t)pcStack_60;
    }
    do {
      for (badkey = (known_host *)_libssh2_list_first((list_head *)(hostp_local + 8));
          badkey != (known_host *)0x0; badkey = (known_host *)_libssh2_list_next(&badkey->node)) {
        sVar1 = (short)badkey->typemask;
        if (sVar1 == 1) {
          if (keyalloc._4_4_ == 1) {
            iVar2 = strcmp((char *)_match,badkey->name);
            bVar6 = iVar2 == 0;
          }
        }
        else if (sVar1 == 2) {
          if ((keyalloc._4_4_ == 1) &&
             (ctx_00 = (HMAC_CTX *)HMAC_CTX_new(), badkey->name_len == 0x14)) {
            key_00 = badkey->salt;
            sVar4 = badkey->salt_len;
            md = EVP_sha1();
            HMAC_Init_ex(ctx_00,key_00,(int)sVar4,md,(ENGINE *)0x0);
            len_00 = strlen((char *)_match);
            HMAC_Update(ctx_00,(uchar *)_match,len_00);
            HMAC_Final(ctx_00,(uchar *)&ctx,(uint *)0x0);
            HMAC_CTX_free(ctx_00);
            iVar2 = memcmp(&ctx,badkey->name,0x14);
            if (iVar2 == 0) {
              bVar6 = true;
            }
          }
        }
        else if ((sVar1 == 3) && (keyalloc._4_4_ == 3)) {
          iVar2 = strcmp((char *)_match,badkey->name);
          bVar6 = iVar2 == 0;
        }
        if (bVar6) {
          uVar3 = node._4_4_ & 0x3c0000;
          if ((uVar3 != 0x3c0000) && ((uVar3 == 0 || (uVar3 == (badkey->typemask & 0x3c0000U))))) {
            iVar2 = strcmp((char *)keylen_local,badkey->key);
            if (iVar2 == 0) {
              if (ext != (libssh2_knownhost **)0x0) {
                plVar5 = knownhost_to_external(badkey);
                *ext = plVar5;
              }
              pkStack_50 = (known_host *)0x0;
              stack0xffffffffffffff9c = 0;
              break;
            }
            if (pkStack_50 == (known_host *)0x0) {
              pkStack_50 = badkey;
            }
          }
          bVar6 = false;
        }
      }
      _match = ppcStack_20;
      bVar7 = false;
      if (!bVar6) {
        len = len + -1;
        bVar7 = len != 0;
      }
    } while (bVar7);
    if (pkStack_50 != (known_host *)0x0) {
      if (ext != (libssh2_knownhost **)0x0) {
        plVar5 = knownhost_to_external(pkStack_50);
        *ext = plVar5;
      }
      stack0xffffffffffffff9c = 1;
    }
    if (pcStack_60 != (char *)0x0) {
      (**(code **)(*(long *)hostp_local + 0x18))(pcStack_60,*(undefined8 *)hostp_local);
    }
    hosts_local._4_4_ = stack0xffffffffffffff9c;
  }
  return hosts_local._4_4_;
}

Assistant:

static int
knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,
                const char *hostp, int port,
                const char *key, size_t keylen,
                int typemask,
                struct libssh2_knownhost **ext)
{
    struct known_host *node;
    struct known_host *badkey = NULL;
    int type = typemask & LIBSSH2_KNOWNHOST_TYPE_MASK;
    char *keyalloc = NULL;
    int rc = LIBSSH2_KNOWNHOST_CHECK_NOTFOUND;
    char hostbuff[270]; /* most host names can't be longer than like 256 */
    const char *host;
    int numcheck; /* number of host combos to check */
    int match = 0;

    if(type == LIBSSH2_KNOWNHOST_TYPE_SHA1)
        /* we can't work with a sha1 as given input */
        return LIBSSH2_KNOWNHOST_CHECK_MISMATCH;

    /* if a port number is given, check for a '[host]:port' first before the
       plain 'host' */
    if(port >= 0) {
        int len = snprintf(hostbuff, sizeof(hostbuff), "[%s]:%d", hostp, port);
        if(len < 0 || len >= (int)sizeof(hostbuff)) {
            _libssh2_error(hosts->session,
                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Known-host write buffer too small");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }
        host = hostbuff;
        numcheck = 2; /* check both combos, start with this */
    }
    else {
        host = hostp;
        numcheck = 1; /* only check this host version */
    }

    if(!(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64)) {
        /* we got a raw key input, convert it to base64 for the checks below */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &keyalloc);
        if(!nlen) {
            _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for base64-encoded "
                           "key");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }

        /* make the key point to this */
        key = keyalloc;
    }

    do {
        node = _libssh2_list_first(&hosts->head);
        while(node) {
            switch(node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) {
            case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
                if(type == LIBSSH2_KNOWNHOST_TYPE_CUSTOM)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_SHA1:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN) {
                    /* when we have the sha1 version stored, we can use a
                       plain input to produce a hash to compare with the
                       stored hash.
                    */
                    unsigned char hash[SHA_DIGEST_LENGTH];
                    libssh2_hmac_ctx ctx;
                    libssh2_hmac_ctx_init(ctx);

                    if(SHA_DIGEST_LENGTH != node->name_len) {
                        /* the name hash length must be the sha1 size or
                           we can't match it */
                        break;
                    }
                    libssh2_hmac_sha1_init(&ctx, (unsigned char *)node->salt,
                                           node->salt_len);
                    libssh2_hmac_update(ctx, (unsigned char *)host,
                                        strlen(host));
                    libssh2_hmac_final(ctx, hash);
                    libssh2_hmac_cleanup(&ctx);

                    if(!memcmp(hash, node->name, SHA_DIGEST_LENGTH))
                        /* this is a node we're interested in */
                        match = 1;
                }
                break;
            default: /* unsupported type */
                break;
            }
            if(match) {
                int host_key_type = typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                int known_key_type =
                    node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                /* match on key type as follows:
                   - never match on an unknown key type
                   - if key_type is set to zero, ignore it an match always
                   - otherwise match when both key types are equal
                */
                if(host_key_type != LIBSSH2_KNOWNHOST_KEY_UNKNOWN &&
                     (host_key_type == 0 ||
                      host_key_type == known_key_type)) {
                    /* host name and key type match, now compare the keys */
                    if(!strcmp(key, node->key)) {
                        /* they match! */
                        if(ext)
                            *ext = knownhost_to_external(node);
                        badkey = NULL;
                        rc = LIBSSH2_KNOWNHOST_CHECK_MATCH;
                        break;
                    }
                    else {
                        /* remember the first node that had a host match but a
                           failed key match since we continue our search from
                           here */
                        if(!badkey)
                            badkey = node;
                    }
                }
                match = 0; /* don't count this as a match anymore */
            }
            node = _libssh2_list_next(&node->node);
        }
        host = hostp;
    } while(!match && --numcheck);

    if(badkey) {
        /* key mismatch */
        if(ext)
            *ext = knownhost_to_external(badkey);
        rc = LIBSSH2_KNOWNHOST_CHECK_MISMATCH;
    }

    if(keyalloc)
        LIBSSH2_FREE(hosts->session, keyalloc);

    return rc;
}